

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

void dfpair_sz(FILE *f,uint sz,char *key,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  char *__s;
  char *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  FILE *in_RDI;
  __gnuc_va_list in_R8;
  uint n;
  char *buf;
  
  __s = (char *)operator_new__((ulong)in_ESI);
  uVar1 = snprintf(__s,(ulong)in_ESI,"#pair  \"%s\"\t\"",in_RDX);
  if (uVar1 <= in_ESI) {
    vsnprintf(__s + uVar1,(ulong)(in_ESI - uVar1),in_RCX,in_R8);
    fprintf(in_RDI,"%s\"\n",__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
    return;
  }
  __assert_fail("n <= sz",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/utils.cc"
                ,0x35,
                "void dfpair_sz(FILE *, unsigned int, const char *, const char *, __va_list_tag *)")
  ;
}

Assistant:

static void dfpair_sz(FILE *f, unsigned int sz, const char *key, const char *fmt, va_list ap) {
	char *buf = new char[sz];

	unsigned int n = snprintf(buf, sz, "#pair  \"%s\"\t\"", key);
	assert (n <= sz);
	vsnprintf(buf+n, sz-n, fmt, ap);

	fprintf(f, "%s\"\n", buf);
	delete[] buf;
}